

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void linenoisePrintKeyCodes(void)

{
  uint3 uVar1;
  long lVar2;
  int iVar3;
  ssize_t sVar4;
  ushort **ppuVar5;
  undefined8 uVar6;
  char c;
  long lStack_38;
  char quit [4];
  
  puts(
      "Linenoise key codes debugging mode.\nPress keys to see scan codes. Type \'quit\' at any time to exit."
      );
  iVar3 = enableRawMode(0);
  if (iVar3 != -1) {
    lStack_38 = 0x2020202000000000;
    while( true ) {
      do {
        sVar4 = read(0,&c,1);
      } while ((int)sVar4 < 1);
      uVar1 = (uint3)((ulong)lStack_38 >> 0x28);
      lStack_38 = (ulong)uVar1 << 0x20;
      lVar2 = lStack_38;
      quit[3] = '\0';
      quit[0] = (char)uVar1;
      quit[1] = (char)(uVar1 >> 8);
      quit[2] = (char)(uVar1 >> 0x10);
      if (quit == (char  [4])0x74697571) break;
      ppuVar5 = __ctype_b_loc();
      uVar6 = 0x3f;
      if ((**ppuVar5 >> 0xe & 1) != 0) {
        uVar6 = 0;
      }
      printf("\'%c\' %02x (%d) (type quit to exit)\n",uVar6,0,0);
      putchar(0xd);
      fflush(_stdout);
      lStack_38 = lVar2;
    }
    disableRawMode(0);
    return;
  }
  return;
}

Assistant:

void linenoisePrintKeyCodes(void) {
    char quit[4];

    printf("Linenoise key codes debugging mode.\n"
            "Press keys to see scan codes. Type 'quit' at any time to exit.\n");
    if (enableRawMode(STDIN_FILENO) == -1) return;
    memset(quit,' ',4);
    while(1) {
        char c = 0;
        int nread;

        nread = read(STDIN_FILENO,&c,sizeof c);
        if (nread <= 0) continue;
        memmove(quit,quit+1,sizeof(quit)-1); /* shift string to left. */
        quit[sizeof(quit)-1] = c; /* Insert current char on the right. */
        if (memcmp(quit,"quit",sizeof(quit)) == 0) break;

        printf("'%c' %02x (%d) (type quit to exit)\n",
            isprint((int)c) ? c : '?', (int)c, (int)c);
        printf("\r"); /* Go left edge manually, we are in raw mode. */
        fflush(stdout);
    }
    disableRawMode(STDIN_FILENO);
}